

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O2

void LabelMission(int id)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  char *__s;
  
  uVar2 = (ulong)(uint)id;
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  if (missionfile == (FILE *)0x0 && bMissionRunning == 0) {
    __s = "Cannot use label outside a mission file.";
  }
  else {
    if ((uint)id < 0x400) {
      iVar1 = labels[uVar2];
      iVar3 = ftellline(missionfile);
      if (iVar1 < 1) {
        labels[uVar2] = iVar3;
        if (iVar3 < 1) {
          puts("File error.");
        }
      }
      else if (iVar1 != iVar3) {
        printf("Label %d already exists.\n",uVar2);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
      SetCurrentLabelEx("log/CurLbl.txt",id);
      return;
    }
    __s = "Invalid parameter.";
  }
  puts(__s);
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  return;
}

Assistant:

inline void LabelMission(int id)
{
	EnterCriticalSection(&MissionFilesCS);
	if ((!bMissionRunning)&&(!missionfile))
	{
		printf("Cannot use label outside a mission file.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if ((id < 0)||(id >= MAX_NB_LABELS))
	{
		printf("Invalid parameter.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	// Labels are reset every time a new mission file is opened.
	if (labels[id] > 0) 
	{
		if (labels[id] != ftellline(missionfile))
		{
			printf("Label %d already exists.\n", id);
		}
	}
	else 
	{
		labels[id] = ftellline(missionfile);
		if (labels[id] <= 0)
		{
			printf("File error.\n");
		}
	}
	LeaveCriticalSection(&MissionFilesCS);
	SetCurrentLabelEx(LOG_FOLDER"CurLbl.txt", id);
}